

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

iterator * __thiscall
ghc::filesystem::path::iterator::operator++
          (iterator *__return_storage_ptr__,iterator *this,int param_1)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  
  (__return_storage_ptr__->_iter)._M_current = (this->_iter)._M_current;
  uVar2 = *(undefined4 *)&(this->_first)._M_current;
  uVar3 = *(undefined4 *)((long)&(this->_first)._M_current + 4);
  uVar4 = *(undefined4 *)&(this->_last)._M_current;
  uVar5 = *(undefined4 *)((long)&(this->_last)._M_current + 4);
  uVar6 = *(undefined4 *)((long)&(this->_prefix)._M_current + 4);
  uVar7 = *(undefined4 *)&(this->_root)._M_current;
  uVar8 = *(undefined4 *)((long)&(this->_root)._M_current + 4);
  *(undefined4 *)&(__return_storage_ptr__->_prefix)._M_current =
       *(undefined4 *)&(this->_prefix)._M_current;
  *(undefined4 *)((long)&(__return_storage_ptr__->_prefix)._M_current + 4) = uVar6;
  *(undefined4 *)&(__return_storage_ptr__->_root)._M_current = uVar7;
  *(undefined4 *)((long)&(__return_storage_ptr__->_root)._M_current + 4) = uVar8;
  *(undefined4 *)&(__return_storage_ptr__->_first)._M_current = uVar2;
  *(undefined4 *)((long)&(__return_storage_ptr__->_first)._M_current + 4) = uVar3;
  *(undefined4 *)&(__return_storage_ptr__->_last)._M_current = uVar4;
  *(undefined4 *)((long)&(__return_storage_ptr__->_last)._M_current + 4) = uVar5;
  (__return_storage_ptr__->_current)._path._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_current)._path.field_2;
  pcVar1 = (this->_current)._path._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->_current,pcVar1,
             pcVar1 + (this->_current)._path._M_string_length);
  operator++(this);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path::iterator path::iterator::operator++(int)
{
    path::iterator i{*this};
    ++(*this);
    return i;
}